

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::qdxt_state::qdxt_state(qdxt_state *this,task_pool *tp)

{
  bool *pbVar1;
  long lVar2;
  
  this->m_fmt = PIXEL_FMT_INVALID;
  qdxt1::qdxt1(&this->m_qdxt1,tp);
  qdxt5::qdxt5(&this->m_qdxt5a,tp);
  qdxt5::qdxt5(&this->m_qdxt5b,tp);
  (this->m_pixel_blocks).m_p = (dxt_pixel_block *)0x0;
  (this->m_pixel_blocks).m_size = 0;
  (this->m_pixel_blocks).m_capacity = 0;
  (this->m_qdxt1_params).m_quality_level = 0xff;
  (this->m_qdxt1_params).m_dxt1a_alpha_threshold = 0;
  (this->m_qdxt1_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_qdxt1_params).m_perceptual = true;
  (this->m_qdxt1_params).m_use_alpha_blocks = true;
  (this->m_qdxt1_params).m_hierarchical = true;
  (this->m_qdxt1_params).m_num_mips = 0;
  (this->m_qdxt1_params).m_pProgress_func = (progress_callback_func)0x0;
  (this->m_qdxt1_params).m_pProgress_data = (void *)0x0;
  lVar2 = 0;
  memset((this->m_qdxt1_params).m_mip_desc,0,0x600);
  (this->m_qdxt1_params).m_progress_start = 0;
  (this->m_qdxt1_params).m_progress_range = 100;
  do {
    pbVar1 = &this->m_qdxt5_params[0].m_use_both_block_types + lVar2;
    ((qdxt5_params *)(pbVar1 + -0x62c))->m_quality_level = 0xff;
    ((qdxt5_params *)(pbVar1 + -0x62c))->m_dxt_quality = cCRNDXTQualityUber;
    *(uint *)(pbVar1 + -0x620) = 0;
    *(progress_callback_func *)(pbVar1 + -0x1c) = (progress_callback_func)0x0;
    *(void **)(pbVar1 + -0x14) = (void *)0x0;
    pbVar1[-0x624] = true;
    memset((mip_desc *)(pbVar1 + -0x61c),0,0x600);
    *(uint *)(pbVar1 + -4) = 3;
    *(undefined8 *)(pbVar1 + -0xc) = 0x6400000000;
    *pbVar1 = true;
    lVar2 = lVar2 + 0x630;
  } while (lVar2 != 0xc60);
  return;
}

Assistant:

qdxt_state(task_pool& tp)
        : m_fmt(PIXEL_FMT_INVALID), m_qdxt1(tp), m_qdxt5a(tp), m_qdxt5b(tp) {
    }